

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

string * __thiscall
cmDependsFortran::MaybeConvertToRelativePath
          (string *__return_storage_ptr__,cmDependsFortran *this,string *base,string *path)

{
  pointer pcVar1;
  bool bVar2;
  cmStateSnapshot cStack_68;
  cmStateDirectory local_50;
  
  cmLocalGenerator::GetStateSnapshot(&cStack_68,(this->super_cmDepends).LocalGenerator);
  cmStateSnapshot::GetDirectory(&local_50,&cStack_68);
  bVar2 = cmOutputConverter::ContainedInDirectory(base,path,&local_50);
  if (bVar2) {
    cmOutputConverter::ForceToRelativePath(__return_storage_ptr__,base,path);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmDependsFortran::MaybeConvertToRelativePath(
  std::string const& base, std::string const& path)
{
  if (!cmOutputConverter::ContainedInDirectory(
        base, path, this->LocalGenerator->GetStateSnapshot().GetDirectory())) {
    return path;
  }
  return cmOutputConverter::ForceToRelativePath(base, path);
}